

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_decoding_backend_init_file__stbvorbis
                    (void *pUserData,char *pFilePath,ma_decoding_backend_config *pConfig,
                    ma_allocation_callbacks *pAllocationCallbacks,ma_data_source **ppBackend)

{
  ma_decoding_backend_config pVorbis_00;
  char *in_RCX;
  ma_decoding_backend_config *in_R8;
  ma_stbvorbis *pVorbis;
  ma_result result;
  ma_allocation_callbacks *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 local_4;
  
  pVorbis_00 = (ma_decoding_backend_config)
               ma_malloc((size_t)in_stack_ffffffffffffffb8,(ma_allocation_callbacks *)0x214aac);
  if (pVorbis_00 == (ma_decoding_backend_config)0x0) {
    local_4 = MA_OUT_OF_MEMORY;
  }
  else {
    local_4 = ma_stbvorbis_init_file
                        (in_RCX,in_R8,
                         (ma_allocation_callbacks *)
                         CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                         (ma_stbvorbis *)pVorbis_00);
    if (local_4 == MA_SUCCESS) {
      *in_R8 = pVorbis_00;
      local_4 = MA_SUCCESS;
    }
    else {
      ma_free((void *)pVorbis_00,in_stack_ffffffffffffffb8);
    }
  }
  return local_4;
}

Assistant:

static ma_result ma_decoding_backend_init_file__stbvorbis(void* pUserData, const char* pFilePath, const ma_decoding_backend_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_data_source** ppBackend)
{
    ma_result result;
    ma_stbvorbis* pVorbis;

    (void)pUserData;    /* For now not using pUserData, but once we start storing the vorbis decoder state within the ma_decoder structure this will be set to the decoder so we can avoid a malloc. */

    /* For now we're just allocating the decoder backend on the heap. */
    pVorbis = (ma_stbvorbis*)ma_malloc(sizeof(*pVorbis), pAllocationCallbacks);
    if (pVorbis == NULL) {
        return MA_OUT_OF_MEMORY;
    }

    result = ma_stbvorbis_init_file(pFilePath, pConfig, pAllocationCallbacks, pVorbis);
    if (result != MA_SUCCESS) {
        ma_free(pVorbis, pAllocationCallbacks);
        return result;
    }

    *ppBackend = pVorbis;

    return MA_SUCCESS;
}